

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll.c
# Opt level: O2

int poll_dispatch(event_base *base,timeval *tv)

{
  pollfd *__fds;
  ushort uVar1;
  uint uVar2;
  int iVar3;
  void *ptr;
  ulong uVar4;
  int *piVar5;
  ushort uVar6;
  int iVar7;
  char *fmt;
  ulong uVar8;
  int iVar9;
  int *piVar10;
  bool bVar11;
  
  piVar5 = (int *)base->evbase;
  iVar7 = piVar5[1];
  if (base->th_base_lock == (void *)0x0) {
    piVar10 = piVar5 + 4;
LAB_001cd860:
    __fds = *(pollfd **)piVar10;
    if (tv == (timeval *)0x0) {
      iVar3 = -1;
    }
    else {
      uVar4 = evutil_tv_to_msec_(tv);
      uVar8 = 0x7fffffff;
      if (uVar4 < 0x7fffffff) {
        uVar8 = uVar4;
      }
      iVar3 = (int)uVar8;
    }
    if (base->th_base_lock != (void *)0x0) {
      (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
    }
    uVar2 = poll(__fds,(long)iVar7,iVar3);
    if (base->th_base_lock != (void *)0x0) {
      (*evthread_lock_fns_.lock)(0,base->th_base_lock);
    }
    if (uVar2 == 0xffffffff) {
      piVar5 = __errno_location();
      if (*piVar5 != 4) {
        fmt = "poll";
        goto LAB_001cd983;
      }
    }
    else {
      if (event_debug_logging_mask_ != 0) {
        event_debugx_("%s: poll reports %d","poll_dispatch",(ulong)uVar2);
      }
      if (iVar7 != 0 && uVar2 != 0) {
        iVar3 = evutil_weakrand_range_(&base->weakrand_seed,iVar7);
        iVar9 = 0;
        if (0 < iVar7) {
          iVar9 = iVar7;
        }
        while (bVar11 = iVar9 != 0, iVar9 = iVar9 + -1, bVar11) {
          iVar3 = iVar3 + 1;
          if (iVar3 == iVar7) {
            iVar3 = 0;
          }
          uVar6 = __fds[iVar3].revents;
          if (uVar6 != 0) {
            uVar1 = uVar6 | 5;
            if ((uVar6 & 0x38) == 0) {
              uVar1 = uVar6;
            }
            uVar6 = uVar1 & 4 | uVar1 * 2 & 2;
            if (uVar6 != 0) {
              evmap_io_active_(base,__fds[iVar3].fd,uVar6);
            }
          }
        }
        return 0;
      }
    }
    iVar7 = 0;
  }
  else {
    ptr = *(void **)(piVar5 + 6);
    if (piVar5[2] == 0) {
LAB_001cd845:
      piVar10 = piVar5 + 6;
      memcpy(ptr,*(void **)(piVar5 + 4),(long)iVar7 * 8);
      goto LAB_001cd860;
    }
    ptr = event_mm_realloc_(ptr,(long)*piVar5 << 3);
    if (ptr != (void *)0x0) {
      *(void **)(piVar5 + 6) = ptr;
      piVar5[2] = 0;
      goto LAB_001cd845;
    }
    fmt = "realloc";
LAB_001cd983:
    iVar7 = -1;
    event_warn(fmt);
  }
  return iVar7;
}

Assistant:

static int
poll_dispatch(struct event_base *base, struct timeval *tv)
{
	int res, i, j, nfds;
	long msec = -1;
	struct pollop *pop = base->evbase;
	struct pollfd *event_set;

	poll_check_ok(pop);

	nfds = pop->nfds;

#ifndef EVENT__DISABLE_THREAD_SUPPORT
	if (base->th_base_lock) {
		/* If we're using this backend in a multithreaded setting,
		 * then we need to work on a copy of event_set, so that we can
		 * let other threads modify the main event_set while we're
		 * polling. If we're not multithreaded, then we'll skip the
		 * copy step here to save memory and time. */
		if (pop->realloc_copy) {
			struct pollfd *tmp = mm_realloc(pop->event_set_copy,
			    pop->event_count * sizeof(struct pollfd));
			if (tmp == NULL) {
				event_warn("realloc");
				return -1;
			}
			pop->event_set_copy = tmp;
			pop->realloc_copy = 0;
		}
		memcpy(pop->event_set_copy, pop->event_set,
		    sizeof(struct pollfd)*nfds);
		event_set = pop->event_set_copy;
	} else {
		event_set = pop->event_set;
	}
#else
	event_set = pop->event_set;
#endif

	if (tv != NULL) {
		msec = evutil_tv_to_msec_(tv);
		if (msec < 0 || msec > INT_MAX)
			msec = INT_MAX;
	}

	EVBASE_RELEASE_LOCK(base, th_base_lock);

	res = poll(event_set, nfds, msec);

	EVBASE_ACQUIRE_LOCK(base, th_base_lock);

	if (res == -1) {
		if (errno != EINTR) {
			event_warn("poll");
			return (-1);
		}

		return (0);
	}

	event_debug(("%s: poll reports %d", __func__, res));

	if (res == 0 || nfds == 0)
		return (0);

	i = evutil_weakrand_range_(&base->weakrand_seed, nfds);
	for (j = 0; j < nfds; j++) {
		int what;
		if (++i == nfds)
			i = 0;
		what = event_set[i].revents;
		if (!what)
			continue;

		res = 0;

		/* If the file gets closed notify */
		if (what & (POLLHUP|POLLERR|POLLNVAL))
			what |= POLLIN|POLLOUT;
		if (what & POLLIN)
			res |= EV_READ;
		if (what & POLLOUT)
			res |= EV_WRITE;
		if (res == 0)
			continue;

		evmap_io_active_(base, event_set[i].fd, res);
	}

	return (0);
}